

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::GetParameters
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FeedForwardNN<double> *this)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  mapped_type *pmVar4;
  pointer piVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  uint local_44;
  int local_40;
  int local_3c;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)this->_NpPrep + (long)this->_Np,
             (allocator_type *)&local_44);
  piVar5 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_44 = (uint)((ulong)((long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2);
  uVar8 = 0;
  if (1 < (int)local_44) {
    local_38 = &this->_Biases;
    do {
      local_44 = local_44 - 1;
      local_3c = 0;
      if (0 < piVar5[local_44]) {
        do {
          pmVar4 = std::
                   map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                   ::at(local_38,(key_type *)&local_44);
          local_40 = 0;
          dVar9 = Matrix<double>::GetElement(pmVar4,&local_3c,&local_40);
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[(int)uVar8] = dVar9;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          local_40 = 0;
          piVar5 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = (long)(int)local_44;
          if (0 < piVar5[lVar6 + -1]) {
            uVar8 = (ulong)(int)uVar7;
            do {
              pmVar4 = std::
                       map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                       ::at(&this->_Links,(key_type *)&local_44);
              dVar9 = Matrix<double>::GetElement(pmVar4,&local_3c,&local_40);
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8] = dVar9;
              local_40 = local_40 + 1;
              uVar8 = uVar8 + 1;
              piVar5 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar6 = (long)(int)local_44;
            } while (local_40 < piVar5[lVar6 + -1]);
          }
          local_3c = local_3c + 1;
        } while (local_3c < piVar5[lVar6]);
      }
    } while (1 < (int)local_44);
    uVar8 = (ulong)(int)uVar8;
  }
  iVar1 = this->_NpPrep;
  if (0 < (long)iVar1) {
    pdVar2 = (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pdVar3[uVar8 + lVar6] = pdVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> GetParameters() const
    {
      // Initialise output vector
      std::vector<T> output(_Np + _NpPrep);

      // Element counter
      int count = 0;

      // Number of layers
      const int nl = (int) _Arch.size();

      // Neural network parameters
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            output[count++] = _Biases.at(l).GetElement(i, 0);

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              output[count++] = _Links.at(l).GetElement(i, j);
          }

      // Preprocessing parameters
      for (int ip = 0; ip < _NpPrep; ip++)
        output[count++] = _PreprocPars[ip];

      return output;
    }